

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

Opcode __thiscall Jinx::Impl::Parser::ParseBinaryOperator(Parser *this)

{
  pointer pSVar1;
  bool local_25;
  Opcode local_24;
  const_iterator cStack_20;
  Opcode opcode;
  Parser *local_18;
  Parser *this_local;
  
  local_25 = true;
  local_18 = this;
  if ((this->m_error & 1U) == 0) {
    cStack_20 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    local_25 = __gnu_cxx::operator==(&this->m_currentSymbol,&stack0xffffffffffffffe0);
  }
  if (local_25 == false) {
    local_24 = NumOpcodes;
    pSVar1 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    switch(pSVar1->type) {
    case ForwardSlash:
      local_24 = Divide;
      break;
    case Asterisk:
      local_24 = Multiply;
      break;
    case Plus:
      local_24 = Add;
      break;
    case Minus:
      local_24 = Subtract;
      break;
    case Equals:
      local_24 = Equals;
      break;
    case NotEquals:
      local_24 = NotEquals;
      break;
    case Percent:
      local_24 = Mod;
      break;
    default:
      Error<>(this,"Unknown type when parsing binary operator");
      break;
    case LessThan:
      local_24 = Less;
      break;
    case LessThanEquals:
      local_24 = LessEq;
      break;
    case GreaterThan:
      local_24 = Greater;
      break;
    case GreaterThanEquals:
      local_24 = GreaterEq;
      break;
    case And:
      local_24 = And;
      break;
    case Or:
      local_24 = Or;
    }
    NextSymbol(this);
    this_local._4_4_ = local_24;
  }
  else {
    this_local._4_4_ = NumOpcodes;
  }
  return this_local._4_4_;
}

Assistant:

inline_t Opcode Parser::ParseBinaryOperator()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return Opcode::NumOpcodes;

		Opcode opcode = Opcode::NumOpcodes;
		switch (m_currentSymbol->type)
		{
		case SymbolType::And:
			opcode = Opcode::And;
			break;
		case SymbolType::Asterisk:
			opcode = Opcode::Multiply;
			break;
		case SymbolType::Equals:
			opcode = Opcode::Equals;
			break;
		case SymbolType::NotEquals:
			opcode = Opcode::NotEquals;
			break;
		case SymbolType::ForwardSlash:
			opcode = Opcode::Divide;
			break;
		case SymbolType::GreaterThan:
			opcode = Opcode::Greater;
			break;
		case SymbolType::GreaterThanEquals:
			opcode = Opcode::GreaterEq;
			break;
		case SymbolType::LessThan:
			opcode = Opcode::Less;
			break;
		case SymbolType::LessThanEquals:
			opcode = Opcode::LessEq;
			break;
		case SymbolType::Minus:
			opcode = Opcode::Subtract;
			break;
		case SymbolType::Or:
			opcode = Opcode::Or;
			break;
		case SymbolType::Percent:
			opcode = Opcode::Mod;
			break;
		case SymbolType::Plus:
			opcode = Opcode::Add;
			break;
		default:
			Error("Unknown type when parsing binary operator");
			break;
		}
		NextSymbol();
		return opcode;
	}